

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testHeader.cpp
# Opt level: O1

void testEraseAttributeThrowsWithEmptyString(void)

{
  Header header;
  undefined8 local_48;
  Header local_40 [56];
  
  local_48 = 0;
  Imf_3_4::Header::Header(local_40,0x40,0x40,1.0,(Vec2 *)&local_48,1.0,INCREASING_Y,ZIP_COMPRESSION)
  ;
  Imf_3_4::Header::erase((char *)local_40);
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testHeader.cpp"
                ,0x4e,"void testEraseAttributeThrowsWithEmptyString()");
}

Assistant:

void
testEraseAttributeThrowsWithEmptyString ()
{
    Header header;

    try
    {
        header.erase ("");
        assert (false);
    }
    catch (const ArgExc&)
    {
        assert (true);
    }
}